

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sms_Apu.cpp
# Opt level: O1

void __thiscall Sms_Noise::run(Sms_Noise *this,blip_time_t time,blip_time_t end_time)

{
  uint uVar1;
  Blip_Buffer *buf;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  iVar2 = (this->super_Sms_Osc).volume;
  iVar5 = -iVar2;
  if ((this->shifter & 1) == 0) {
    iVar5 = iVar2;
  }
  iVar2 = iVar5 - (this->super_Sms_Osc).last_amp;
  if (iVar2 != 0) {
    (this->super_Sms_Osc).last_amp = iVar5;
    Blip_Synth<8,_1>::offset(&this->synth,time,iVar2,(this->super_Sms_Osc).output);
  }
  iVar2 = time + (this->super_Sms_Osc).delay;
  if ((this->super_Sms_Osc).volume == 0) {
    iVar2 = end_time;
  }
  if (iVar2 < end_time) {
    buf = (this->super_Sms_Osc).output;
    uVar3 = this->shifter;
    iVar5 = iVar5 * 2;
    iVar4 = 0x10;
    if (*this->period != 0) {
      iVar4 = *this->period * 2;
    }
    do {
      uVar1 = this->feedback;
      if ((uVar3 + 1 & 2) != 0) {
        iVar5 = -iVar5;
        Blip_Synth<8,_1>::offset_inline(&this->synth,iVar2,iVar5,buf);
      }
      uVar3 = -(uVar3 & 1) & uVar1 ^ uVar3 >> 1;
      iVar2 = iVar2 + iVar4;
    } while (iVar2 < end_time);
    this->shifter = uVar3;
    (this->super_Sms_Osc).last_amp = iVar5 >> 1;
  }
  (this->super_Sms_Osc).delay = iVar2 - end_time;
  return;
}

Assistant:

void Sms_Noise::run( blip_time_t time, blip_time_t end_time )
{
	int amp = volume;
	if ( shifter & 1 )
		amp = -amp;
	
	{
		int delta = amp - last_amp;
		if ( delta )
		{
			last_amp = amp;
			synth.offset( time, delta, output );
		}
	}
	
	time += delay;
	if ( !volume )
		time = end_time;
	
	if ( time < end_time )
	{
		Blip_Buffer* const output = this->output;
		unsigned shifter = this->shifter;
		int delta = amp * 2;
		int period = *this->period * 2;
		if ( !period )
			period = 16;
		
		do
		{
			int changed = shifter + 1;
			shifter = (feedback & (unsigned)-(signed)(shifter & 1)) ^ (shifter >> 1);
			if ( changed & 2 ) // true if bits 0 and 1 differ
			{
				delta = -delta;
				synth.offset_inline( time, delta, output );
			}
			time += period;
		}
		while ( time < end_time );
		
		this->shifter = shifter;
		this->last_amp = delta >> 1;
	}
	delay = time - end_time;
}